

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.cc
# Opt level: O0

uint64_t hashall(substring s,uint64_t h)

{
  uint64_t uVar1;
  uint64_t in_stack_00000020;
  size_t in_stack_00000028;
  void *in_stack_00000030;
  
  uVar1 = uniform_hash(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  return uVar1;
}

Assistant:

uint64_t hashall(substring s, uint64_t h) { return uniform_hash((unsigned char*)s.begin, s.end - s.begin, h); }